

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiScanlinePartThreading.cpp
# Opt level: O1

void testMultiScanlinePartThreading(string *tempDir)

{
  pointer pcVar1;
  size_t sVar2;
  void *pvVar3;
  pointer pOVar4;
  pointer pOVar5;
  Header *pHVar6;
  Header *pHVar7;
  pointer pIVar8;
  _Alloc_hider _Var9;
  char cVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ostream *poVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  ThreadPool *pTVar20;
  Task *pTVar21;
  undefined8 *puVar22;
  undefined8 *puVar23;
  float *pfVar24;
  float *pfVar25;
  int *piVar26;
  ChannelList *this;
  ChannelList *pCVar27;
  long *plVar28;
  ulong uVar29;
  ulong uVar30;
  undefined4 uVar31;
  undefined1 *puVar32;
  ulong uVar33;
  MultiPartOutputFile *pMVar34;
  int i;
  Header *this_00;
  int y;
  long lVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  FrameBuffer *pFVar39;
  ulong uVar40;
  char **ppcVar41;
  bool bVar42;
  bool bVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar52;
  int iVar53;
  int iVar54;
  long local_368;
  int local_35c;
  int pixelTypes [2];
  ulong local_350;
  vector<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_> parts;
  Header header;
  vector<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_> parts_1;
  string fn;
  InputPart part_1;
  MultiPartInputFile file_1;
  undefined8 uStack_280;
  OutputPart part;
  long alStack_270 [5];
  MultiPartOutputFile file;
  long alStack_240 [6];
  string *local_210;
  int local_208 [2];
  undefined8 uStack_200;
  char *local_1f8;
  char *local_1f0 [4];
  long local_1d0;
  long local_1c8 [2];
  FrameBuffer frameBuffers [2];
  ios_base local_138 [264];
  long lVar51;
  
  local_210 = tempDir;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing the two threads reading/writing on two-scanline-part file",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar11 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar11);
  local_208[0] = -0x80000000;
  local_208[1] = 0x80000000;
  uStack_200._0_4_ = 0x80000000;
  uStack_200._4_4_ = 0x80000000;
  local_35c = 0;
  do {
    iVar11 = 0;
    do {
      fn._M_dataplus._M_p = (pointer)&fn.field_2;
      pixelTypes[0] = local_35c;
      pcVar1 = (local_210->_M_dataplus)._M_p;
      pixelTypes[1] = iVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fn,pcVar1,pcVar1 + local_210->_M_string_length);
      std::__cxx11::string::append((char *)&fn);
      lVar14 = 0x10;
      do {
        puVar32 = (undefined1 *)((long)local_1f0 + lVar14 + -8);
        *(undefined1 **)((long)local_208 + lVar14) = puVar32;
        *(undefined8 *)((long)&uStack_200 + lVar14) = 0;
        *puVar32 = 0;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0x50);
      ppcVar41 = &local_1f8;
      lVar14 = 0;
      do {
        if ((ulong)(uint)pixelTypes[lVar14] < 3) {
          std::__cxx11::string::_M_replace
                    ((ulong)ppcVar41,0,ppcVar41[1],
                     (ulong)(&DAT_001c6584 +
                            *(int *)(&DAT_001c6584 + (ulong)(uint)pixelTypes[lVar14] * 4)));
        }
        lVar14 = lVar14 + 1;
        ppcVar41 = ppcVar41 + 4;
      } while (lVar14 == 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"part 1: ",8);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_1f8,(long)local_1f0[0]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," scanline part, ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"part 2: ",8);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,local_1f0[3],local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," scanline part. ",0x10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers ",0x13);
      std::ostream::flush();
      pHVar7 = DAT_001f1c60;
      pHVar6 = (anonymous_namespace)::headers;
      this_00 = (anonymous_namespace)::headers;
      if (DAT_001f1c60 != (anonymous_namespace)::headers) {
        do {
          Imf_3_2::Header::~Header(this_00);
          this_00 = this_00 + 0x38;
        } while (this_00 != pHVar7);
        DAT_001f1c60 = pHVar6;
      }
      lVar14 = 0;
      do {
        frameBuffers[0]._map._M_t._M_impl._0_8_ = 0;
        Imf_3_2::Header::Header
                  (&header,0xc5,0x107,1.0,(Vec2 *)frameBuffers,1.0,INCREASING_Y,ZIP_COMPRESSION);
        iVar13 = pixelTypes[lVar14];
        std::__cxx11::stringstream::stringstream((stringstream *)frameBuffers);
        std::ostream::operator<<
                  (&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                   (int)lVar14);
        std::__cxx11::stringbuf::str();
        Imf_3_2::Header::setName((string *)&header);
        if (parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&parts.
                      super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(parts.
                          super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)(parts.
                                  super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (iVar13 == 0) {
          pcVar16 = (char *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&parts,UINT,1,1,false);
          Imf_3_2::ChannelList::insert(pcVar16,(Channel *)"UINT");
        }
        else if (iVar13 == 1) {
          pcVar16 = (char *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&parts,FLOAT,1,1,false);
          Imf_3_2::ChannelList::insert(pcVar16,(Channel *)"FLOAT");
        }
        else if (iVar13 == 2) {
          pcVar16 = (char *)Imf_3_2::Header::channels();
          Imf_3_2::Channel::Channel((Channel *)&parts,HALF,1,1,false);
          Imf_3_2::ChannelList::insert(pcVar16,(Channel *)"HALF");
        }
        Imf_3_2::Header::setType((string *)&header);
        std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                  ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                   &(anonymous_namespace)::headers,&header);
        std::__cxx11::stringstream::~stringstream((stringstream *)frameBuffers);
        std::ios_base::~ios_base(local_138);
        Imf_3_2::Header::~Header(&header);
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing files ",0xe)
      ;
      std::ostream::flush();
      pcVar17 = (char *)operator_new__(0x3298c);
      uVar12 = 1;
      uVar33 = 0;
      lVar14 = 0;
      pcVar16 = pcVar17;
      do {
        lVar35 = 1;
        iVar13 = (int)uVar33;
        auVar45 = _DAT_001bcae0;
        uVar37 = uVar12;
        do {
          if (SUB164(auVar45 ^ _DAT_001bcaf0,4) == local_208[0] &&
              SUB164(auVar45 ^ _DAT_001bcaf0,0) < -0x7fffff3b) {
            *(int *)(pcVar16 + lVar35 * 4 + -4) = (int)uVar33 + (int)(uVar33 / 0x801) * -0x801;
            *(uint *)(pcVar16 + lVar35 * 4) = uVar37 % 0x801;
          }
          lVar51 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 2;
          auVar45._8_8_ = lVar51 + 2;
          uVar37 = uVar37 + 2;
          lVar35 = lVar35 + 2;
          uVar33 = (ulong)((int)uVar33 + 2);
        } while (lVar35 != 199);
        lVar14 = lVar14 + 1;
        uVar12 = uVar12 + 0xc5;
        pcVar16 = pcVar16 + 0x314;
        uVar33 = (ulong)(iVar13 + 0xc5);
      } while (lVar14 != 0x107);
      pcVar18 = (char *)operator_new__(0x194c6);
      testMultiScanlinePartThreading();
      pcVar19 = (char *)operator_new__(0x3298c);
      uVar12 = 1;
      uVar37 = 0;
      lVar14 = 0;
      pcVar16 = pcVar19;
      do {
        lVar35 = 1;
        auVar46 = _DAT_001bcae0;
        uVar38 = uVar12;
        uVar36 = uVar37;
        do {
          if (SUB164(auVar46 ^ _DAT_001bcaf0,4) == local_208[0] &&
              SUB164(auVar46 ^ _DAT_001bcaf0,0) < -0x7fffff3b) {
            *(float *)(pcVar16 + lVar35 * 4 + -4) = (float)(uVar36 % 0x801);
            *(float *)(pcVar16 + lVar35 * 4) = (float)(uVar38 % 0x801);
          }
          lVar51 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 2;
          auVar46._8_8_ = lVar51 + 2;
          uVar38 = uVar38 + 2;
          lVar35 = lVar35 + 2;
          uVar36 = uVar36 + 2;
        } while (lVar35 != 199);
        lVar14 = lVar14 + 1;
        uVar12 = uVar12 + 0xc5;
        pcVar16 = pcVar16 + 0x314;
        uVar37 = uVar37 + 0xc5;
      } while (lVar14 != 0x107);
      remove(fn._M_dataplus._M_p);
      _Var9 = fn._M_dataplus;
      pHVar7 = DAT_001f1c60;
      pHVar6 = (anonymous_namespace)::headers;
      iVar13 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                (&file,_Var9._M_p,pHVar6,
                 (int)((ulong)((long)pHVar7 - (long)pHVar6) >> 3) * -0x49249249,false,iVar13);
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar14 = 0;
      do {
        lVar35 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar14;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar14
         ) = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
         lVar14) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar14) = lVar35;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar14) = lVar35;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar14) = 0
        ;
        lVar14 = lVar14 + 0x30;
      } while (lVar14 != 0x60);
      pFVar39 = frameBuffers;
      lVar14 = 0;
      do {
        Imf_3_2::OutputPart::OutputPart(&part,&file,(int)lVar14);
        iVar13 = pixelTypes[lVar14];
        if (iVar13 == 2) {
          Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar18,2,0x18a,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar39,(Slice *)"HALF");
        }
        else if (iVar13 == 1) {
          Imf_3_2::Slice::Slice((Slice *)&header,FLOAT,pcVar19,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar39,(Slice *)"FLOAT");
        }
        else if (iVar13 == 0) {
          Imf_3_2::Slice::Slice((Slice *)&header,UINT,pcVar17,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar39,(Slice *)"UINT");
        }
        Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&part);
        if (parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_2::OutputPart,std::allocator<Imf_3_2::OutputPart>>::
          _M_realloc_insert<Imf_3_2::OutputPart_const&>
                    ((vector<Imf_3_2::OutputPart,std::allocator<Imf_3_2::OutputPart>> *)&parts,
                     (iterator)
                     parts.
                     super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&part);
        }
        else {
          *(undefined8 *)
           parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
           _M_impl.super__Vector_impl_data._M_finish = _part;
          parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
               _M_impl.super__Vector_impl_data._M_finish + 8;
        }
        lVar14 = lVar14 + 1;
        pFVar39 = pFVar39 + 1;
      } while (lVar14 == 1);
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&header);
      pTVar20 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(pTVar20,2);
      iVar13 = 0x1a;
      do {
        pTVar21 = (Task *)operator_new(0x20);
        pOVar4 = parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar21,(TaskGroup *)&header);
        *(undefined ***)pTVar21 = &PTR__Task_001ec2f0;
        *(pointer *)(pTVar21 + 0x10) = pOVar4;
        *(undefined4 *)(pTVar21 + 0x18) = 10;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar20);
        pTVar21 = (Task *)operator_new(0x20);
        pOVar4 = parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar21,(TaskGroup *)&header);
        *(undefined ***)pTVar21 = &PTR__Task_001ec2f0;
        *(pointer *)(pTVar21 + 0x10) = pOVar4 + 8;
        *(undefined4 *)(pTVar21 + 0x18) = 10;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar20);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
      pTVar21 = (Task *)operator_new(0x20);
      pOVar4 = parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
               _M_impl.super__Vector_impl_data._M_start;
      IlmThread_3_2::Task::Task(pTVar21,(TaskGroup *)&header);
      *(undefined ***)pTVar21 = &PTR__Task_001ec2f0;
      *(pointer *)(pTVar21 + 0x10) = pOVar4;
      *(undefined4 *)(pTVar21 + 0x18) = 3;
      IlmThread_3_2::ThreadPool::addTask((Task *)pTVar20);
      pTVar21 = (Task *)operator_new(0x20);
      pOVar4 = parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
               _M_impl.super__Vector_impl_data._M_start;
      IlmThread_3_2::Task::Task(pTVar21,(TaskGroup *)&header);
      *(undefined ***)pTVar21 = &PTR__Task_001ec2f0;
      *(pointer *)(pTVar21 + 0x10) = pOVar4 + 8;
      *(undefined4 *)(pTVar21 + 0x18) = 3;
      IlmThread_3_2::ThreadPool::addTask((Task *)pTVar20);
      (**(code **)(*(long *)pTVar20 + 8))(pTVar20);
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar14 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar14));
        lVar14 = lVar14 + -0x30;
      } while (lVar14 != -0x30);
      if (parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(parts.
                        super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)parts.
                              super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)parts.
                              super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&file);
      operator_delete__(pcVar17);
      operator_delete__(pcVar19);
      operator_delete__(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Checking headers ",0x11);
      std::ostream::flush();
      _Var9 = fn._M_dataplus;
      iVar13 = Imf_3_2::globalThreadCount();
      uVar33 = 1;
      Imf_3_2::MultiPartInputFile::MultiPartInputFile(&file_1,_Var9._M_p,iVar13,true);
      iVar13 = Imf_3_2::MultiPartInputFile::parts();
      if (iVar13 != 2) {
        __assert_fail("file.parts () == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                      ,0x134,"void (anonymous namespace)::readFiles(int *, const std::string &)");
      }
      lVar14 = 0;
      do {
        uVar31 = (undefined4)uVar33;
        Imf_3_2::MultiPartInputFile::header((int)&file_1);
        puVar22 = (undefined8 *)Imf_3_2::Header::displayWindow();
        puVar23 = (undefined8 *)Imf_3_2::Header::displayWindow();
        iVar13 = -(uint)((int)*puVar23 == (int)*puVar22);
        iVar53 = -(uint)((int)((ulong)*puVar23 >> 0x20) == (int)((ulong)*puVar22 >> 0x20));
        auVar47._4_4_ = iVar13;
        auVar47._0_4_ = iVar13;
        auVar47._8_4_ = iVar53;
        auVar47._12_4_ = iVar53;
        iVar13 = movmskpd(uVar31,auVar47);
        if ((iVar13 != 3) ||
           (iVar53 = -(uint)((int)puVar23[1] == (int)puVar22[1]),
           iVar54 = -(uint)((int)((ulong)puVar23[1] >> 0x20) == (int)((ulong)puVar22[1] >> 0x20)),
           auVar48._4_4_ = iVar53, auVar48._0_4_ = iVar53, auVar48._8_4_ = iVar54,
           auVar48._12_4_ = iVar54, iVar53 = movmskpd((int)puVar23,auVar48), iVar53 != 3)) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x138,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar22 = (undefined8 *)Imf_3_2::Header::dataWindow();
        puVar23 = (undefined8 *)Imf_3_2::Header::dataWindow();
        iVar53 = -(uint)((int)*puVar23 == (int)*puVar22);
        iVar54 = -(uint)((int)((ulong)*puVar23 >> 0x20) == (int)((ulong)*puVar22 >> 0x20));
        auVar49._4_4_ = iVar53;
        auVar49._0_4_ = iVar53;
        auVar49._8_4_ = iVar54;
        auVar49._12_4_ = iVar54;
        uVar12 = movmskpd(iVar13,auVar49);
        uVar33 = (ulong)uVar12;
        if ((uVar12 != 3) ||
           (iVar13 = -(uint)((int)puVar23[1] == (int)puVar22[1]),
           iVar53 = -(uint)((int)((ulong)puVar23[1] >> 0x20) == (int)((ulong)puVar22[1] >> 0x20)),
           auVar50._4_4_ = iVar13, auVar50._0_4_ = iVar13, auVar50._8_4_ = iVar53,
           auVar50._12_4_ = iVar53, iVar13 = movmskpd((int)puVar23,auVar50), iVar13 != 3)) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x139,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar24 = (float *)Imf_3_2::Header::pixelAspectRatio();
        fVar44 = *pfVar24;
        pfVar24 = (float *)Imf_3_2::Header::pixelAspectRatio();
        if ((fVar44 != *pfVar24) || (NAN(fVar44) || NAN(*pfVar24))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13a,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar24 = (float *)Imf_3_2::Header::screenWindowCenter();
        pfVar25 = (float *)Imf_3_2::Header::screenWindowCenter();
        if ((((*pfVar24 != *pfVar25) || (NAN(*pfVar24) || NAN(*pfVar25))) ||
            (pfVar24[1] != pfVar25[1])) || (NAN(pfVar24[1]) || NAN(pfVar25[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13c,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar24 = (float *)Imf_3_2::Header::screenWindowWidth();
        fVar44 = *pfVar24;
        pfVar24 = (float *)Imf_3_2::Header::screenWindowWidth();
        if ((fVar44 != *pfVar24) || (NAN(fVar44) || NAN(*pfVar24))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13d,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar26 = (int *)Imf_3_2::Header::lineOrder();
        iVar13 = *piVar26;
        piVar26 = (int *)Imf_3_2::Header::lineOrder();
        if (iVar13 != *piVar26) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13e,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar26 = (int *)Imf_3_2::Header::compression();
        iVar13 = *piVar26;
        piVar26 = (int *)Imf_3_2::Header::compression();
        if (iVar13 != *piVar26) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13f,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        this = (ChannelList *)Imf_3_2::Header::channels();
        pCVar27 = (ChannelList *)Imf_3_2::Header::channels();
        cVar10 = Imf_3_2::ChannelList::operator==(this,pCVar27);
        if (cVar10 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x140,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar22 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        puVar23 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        sVar2 = puVar22[1];
        if ((sVar2 != puVar23[1]) ||
           ((sVar2 != 0 && (iVar13 = bcmp((void *)*puVar22,(void *)*puVar23,sVar2), iVar13 != 0))))
        {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x141,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        puVar22 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        puVar23 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        sVar2 = puVar22[1];
        if ((sVar2 != puVar23[1]) ||
           ((sVar2 != 0 && (iVar13 = bcmp((void *)*puVar22,(void *)*puVar23,sVar2), iVar13 != 0))))
        {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x142,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parts.super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT816(0);
      alStack_240[3] = 0;
      alStack_240[4] = 0;
      alStack_240[1] = 0;
      alStack_240[2] = 0;
      _file = 0;
      alStack_240[0] = 0;
      alStack_270[3] = 0;
      alStack_270[4] = 0;
      alStack_270[1] = 0;
      alStack_270[2] = 0;
      _part = 0;
      alStack_270[0] = 0;
      parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar14 = 0;
      do {
        lVar35 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar14;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar14
         ) = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent +
         lVar14) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar14) = lVar35;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar14) = lVar35;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar14) = 0
        ;
        lVar14 = lVar14 + 0x30;
      } while (lVar14 != 0x60);
      pFVar39 = frameBuffers;
      lVar14 = 0;
      lVar35 = 0;
      do {
        Imf_3_2::InputPart::InputPart(&part_1,&file_1,(int)lVar35);
        iVar13 = pixelTypes[lVar35];
        if (iVar13 == 2) {
          pcVar16 = (char *)operator_new__(0x194c6);
          pvVar3 = *(void **)((long)alStack_270 + lVar14 + 8);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          *(undefined8 *)(&part + lVar14) = 0x107;
          *(undefined8 *)((long)alStack_270 + lVar14) = 0xc5;
          *(char **)((long)alStack_270 + lVar14 + 8) = pcVar16;
          Imf_3_2::Slice::Slice((Slice *)&header,HALF,pcVar16,2,0x18a,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar39,(Slice *)"HALF");
        }
        else if (iVar13 == 1) {
          pcVar16 = (char *)operator_new__(0x3298c);
          pvVar3 = *(void **)((long)alStack_240 + lVar14 + 8);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          *(undefined8 *)(&file + lVar14) = 0x107;
          *(undefined8 *)((long)alStack_240 + lVar14) = 0xc5;
          *(char **)((long)alStack_240 + lVar14 + 8) = pcVar16;
          Imf_3_2::Slice::Slice((Slice *)&header,FLOAT,pcVar16,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar39,(Slice *)"FLOAT");
        }
        else if (iVar13 == 0) {
          pcVar16 = (char *)operator_new__(0x3298c);
          pvVar3 = *(void **)((long)&parts.
                                     super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          *(undefined8 *)
           ((long)&parts.
                   super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar14) = 0x107;
          *(undefined8 *)
           ((long)&parts.
                   super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                   _M_impl.super__Vector_impl_data._M_finish + lVar14) = 0xc5;
          *(char **)((long)&parts.
                            super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) = pcVar16;
          Imf_3_2::Slice::Slice((Slice *)&header,UINT,pcVar16,4,0x314,1,1,0.0,false,false);
          Imf_3_2::FrameBuffer::insert((char *)pFVar39,(Slice *)"UINT");
        }
        Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&part_1);
        if (parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_2::InputPart,std::allocator<Imf_3_2::InputPart>>::
          _M_realloc_insert<Imf_3_2::InputPart_const&>
                    ((vector<Imf_3_2::InputPart,std::allocator<Imf_3_2::InputPart>> *)&parts_1,
                     (iterator)
                     parts_1.
                     super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&part_1);
        }
        else {
          *(undefined8 *)
           parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
           _M_impl.super__Vector_impl_data._M_finish = _part_1;
          parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
               _M_impl.super__Vector_impl_data._M_finish + 8;
        }
        lVar35 = lVar35 + 1;
        lVar14 = lVar14 + 0x18;
        pFVar39 = pFVar39 + 1;
      } while (lVar14 == 0x18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading files ",0xe)
      ;
      std::ostream::flush();
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&header);
      pTVar20 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(pTVar20,2);
      iVar13 = 0;
      do {
        pTVar21 = (Task *)operator_new(0x20);
        pIVar8 = parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar21,(TaskGroup *)&header);
        *(undefined ***)pTVar21 = &PTR__Task_001ec330;
        *(pointer *)(pTVar21 + 0x10) = pIVar8;
        *(int *)(pTVar21 + 0x18) = iVar13;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar20);
        pTVar21 = (Task *)operator_new(0x20);
        pIVar8 = parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        IlmThread_3_2::Task::Task(pTVar21,(TaskGroup *)&header);
        *(undefined ***)pTVar21 = &PTR__Task_001ec330;
        *(pointer *)(pTVar21 + 0x10) = pIVar8 + 8;
        *(int *)(pTVar21 + 0x18) = iVar13;
        IlmThread_3_2::ThreadPool::addTask((Task *)pTVar20);
        iVar13 = iVar13 + 10;
      } while (iVar13 != 0x10e);
      (**(code **)(*(long *)pTVar20 + 8))(pTVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comparing",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      lVar14 = 0;
      do {
        iVar13 = pixelTypes[lVar14];
        if (iVar13 == 2) {
          uVar12 = 0;
          lVar35 = 0;
          uVar33 = 0;
          local_350 = 0;
          do {
            uVar40 = 0;
            bVar43 = false;
            uVar37 = uVar12;
            do {
              iVar13 = (int)uVar40;
              fVar44 = (float)(int)(uVar12 + (uVar37 / 0x801) * -0x801 + iVar13);
              if ((uint)fVar44 < 0x38800000) {
                if ((uint)fVar44 < 0x33000001) {
                  uVar30 = 0;
                }
                else {
                  cVar10 = (char)((uint)fVar44 >> 0x17);
                  uVar36 = (uint)fVar44 & 0x7fffff | 0x800000;
                  uVar38 = uVar36 >> (0x7eU - cVar10 & 0x1f);
                  uVar30 = (ulong)uVar38;
                  if (0x80000000 < uVar36 << (cVar10 + 0xa2U & 0x1f)) {
                    uVar30 = (ulong)(uVar38 + 1);
                  }
                }
              }
              else if ((uint)fVar44 < 0x7f800000) {
                if ((uint)fVar44 < 0x477ff000) {
                  uVar30 = (ulong)((int)fVar44 + 0x8000fff + (uint)(((uint)fVar44 >> 0xd & 1) != 0)
                                  >> 0xd);
                }
                else {
                  uVar30 = 0x7c00;
                }
              }
              else {
                uVar30 = 0x7c00;
                if (fVar44 != INFINITY) {
                  uVar38 = (uint)fVar44 >> 0xd & 0x3ff;
                  uVar30 = (ulong)(uVar38 == 0 | uVar38 | 0x7c00);
                }
              }
              fVar44 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)
                                         (alStack_270[lVar14 * 3] * lVar35 +
                                          alStack_270[lVar14 * 3 + 1] + uVar40 * 2) * 4);
              pfVar24 = (float *)(_imath_half_to_float_table + (uVar30 & 0xffff) * 4);
              if ((fVar44 != *pfVar24) || (NAN(fVar44) || NAN(*pfVar24))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar15 = (ostream *)std::ostream::operator<<(&std::cout,iVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)uVar33);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,": ",2);
                poVar15 = (ostream *)
                          operator<<(poVar15,(half)*(uint16_t *)
                                                    (alStack_270[lVar14 * 3] * lVar35 +
                                                     alStack_270[lVar14 * 3 + 1] + uVar40 * 2));
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,", should be ",0xc);
                uVar40 = (ulong)((uVar37 / 0x801) * 0x801);
                plVar28 = (long *)std::ostream::operator<<
                                            (poVar15,uVar12 + (uVar37 / 0x801) * -0x801 + iVar13);
                std::ios::widen((char)*(undefined8 *)(*plVar28 + -0x18) + (char)plVar28);
                std::ostream::put((char)plVar28);
                std::ostream::flush();
                std::ostream::flush();
                if (!bVar43) goto LAB_0018adc5;
                goto LAB_0018ad99;
              }
              bVar43 = 0xc3 < uVar40;
              uVar40 = uVar40 + 1;
              uVar37 = uVar37 + 1;
            } while (uVar40 != 0xc5);
            uVar40 = 0;
LAB_0018ad99:
            bVar43 = 0x105 < uVar33;
            uVar33 = uVar33 + 1;
            local_350 = CONCAT71((int7)(uVar40 >> 8),bVar43);
            lVar35 = lVar35 + 2;
            uVar12 = uVar12 + 0xc5;
          } while (uVar33 != 0x107);
LAB_0018adc5:
          if ((local_350 & 1) == 0) {
            __assert_fail("checkPixels<half> (hData[i], width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                          ,0x17d,"void (anonymous namespace)::readFiles(int *, const std::string &)"
                         );
          }
        }
        else if (iVar13 == 1) {
          local_368 = 0;
          uVar40 = 1;
          pMVar34 = (MultiPartOutputFile *)0x0;
          uVar33 = 0;
          local_350 = 0;
          do {
            uVar12 = (uint)((int)uVar33 * 0xc5) % 0x801;
            fVar44 = *(float *)(alStack_240[lVar14 * 3 + 1] + alStack_240[lVar14 * 3] * uVar33 * 4);
            iVar13 = (int)pMVar34;
            iVar53 = (int)uVar40;
            if ((fVar44 != (float)uVar12) || (NAN(fVar44) || NAN((float)uVar12))) {
              lVar35 = 0;
              bVar43 = false;
            }
            else {
              uVar30 = 0xffffffffffffffff;
              do {
                uVar29 = uVar30;
                if (uVar29 == 0xc3) goto LAB_0018aae9;
                fVar44 = *(float *)(alStack_240[lVar14 * 3 + 1] +
                                    alStack_240[lVar14 * 3] * local_368 + 8 + uVar29 * 4);
                fVar52 = (float)(iVar53 + (int)(uVar40 / 0x801) * -0x801 + (int)uVar29 + 1);
                uVar30 = uVar29 + 1;
                uVar12 = (int)pMVar34 + 1;
                pMVar34 = (MultiPartOutputFile *)(ulong)uVar12;
                uVar40 = (ulong)((int)uVar40 + 1);
              } while ((fVar44 == fVar52) && (!NAN(fVar44) && !NAN(fVar52)));
              bVar43 = 0xc3 < uVar30;
              lVar35 = uVar29 + 2;
              uVar12 = iVar13 + (uVar12 / 0x801) * -0x801 + (int)uVar30 + 1;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar15 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar35);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
            poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)uVar33);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,": ",2);
            pMVar34 = &file + lVar14 * 0x18;
            poVar15 = std::ostream::_M_insert<double>
                                ((double)*(float *)(alStack_240[lVar14 * 3] * uVar33 * 4 +
                                                    alStack_240[lVar14 * 3 + 1] + lVar35 * 4));
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,", should be ",0xc);
            plVar28 = (long *)std::ostream::operator<<(poVar15,uVar12);
            std::ios::widen((char)*(undefined8 *)(*plVar28 + -0x18) + (char)plVar28);
            std::ostream::put((char)plVar28);
            std::ostream::flush();
            std::ostream::flush();
            if (!bVar43) break;
LAB_0018aae9:
            bVar43 = 0x105 < uVar33;
            uVar33 = uVar33 + 1;
            local_350 = CONCAT71((int7)((ulong)pMVar34 >> 8),bVar43);
            pMVar34 = (MultiPartOutputFile *)(ulong)(iVar13 + 0xc5);
            uVar40 = (ulong)(iVar53 + 0xc5);
            local_368 = local_368 + 4;
          } while (uVar33 != 0x107);
          if ((local_350 & 1) == 0) {
            __assert_fail("checkPixels<float> (fData[i], width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                          ,0x17b,"void (anonymous namespace)::readFiles(int *, const std::string &)"
                         );
          }
        }
        else if (iVar13 == 0) {
          lVar35 = 0;
          uVar12 = 0;
          uVar33 = 0;
          bVar43 = false;
          do {
            pOVar4 = (&parts)[lVar14].
                     super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pOVar5 = (&parts)[lVar14].
                     super__Vector_base<Imf_3_2::OutputPart,_std::allocator<Imf_3_2::OutputPart>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar37 = (uint)((int)uVar33 * 0xc5) % 0x801;
            if (*(uint *)(pOVar5 + (long)pOVar4 * uVar33 * 4) == uVar37) {
              uVar40 = 0;
              uVar37 = uVar12;
              do {
                uVar30 = uVar40;
                if (uVar30 == 0xc4) goto LAB_0018a8a8;
                uVar40 = uVar30 + 1;
                uVar37 = uVar37 + 1;
              } while (uVar12 + (uVar37 / 0x801) * -0x801 + (int)uVar40 ==
                       *(int *)(pOVar5 + uVar30 * 4 + (long)pOVar4 * lVar35 + 4));
              bVar42 = 0xc3 < uVar30;
              uVar37 = (int)uVar40 + uVar12 + (uVar37 / 0x801) * -0x801;
            }
            else {
              uVar40 = 0;
              bVar42 = false;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar15 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar40);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,", ",2);
            poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)uVar33);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,": ",2);
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,", should be ",0xc);
            plVar28 = (long *)std::ostream::operator<<(poVar15,uVar37);
            std::ios::widen((char)*(undefined8 *)(*plVar28 + -0x18) + (char)plVar28);
            std::ostream::put((char)plVar28);
            std::ostream::flush();
            std::ostream::flush();
            if (!bVar42) break;
LAB_0018a8a8:
            bVar43 = 0x105 < uVar33;
            uVar33 = uVar33 + 1;
            uVar12 = uVar12 + 0xc5;
            lVar35 = lVar35 + 4;
          } while (uVar33 != 0x107);
          if (!bVar43) {
            __assert_fail("checkPixels<unsigned int> (uData[i], width, height)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                          ,0x178,"void (anonymous namespace)::readFiles(int *, const std::string &)"
                         );
          }
        }
        bVar43 = lVar14 == 0;
        lVar14 = lVar14 + 1;
      } while (bVar43);
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar14 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar14));
        lVar14 = lVar14 + -0x30;
      } while (lVar14 != -0x30);
      if (parts_1.super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(parts_1.
                        super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)parts_1.
                              super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)parts_1.
                              super__Vector_base<Imf_3_2::InputPart,_std::allocator<Imf_3_2::InputPart>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      lVar14 = 0x30;
      do {
        if (*(void **)((long)&uStack_280 + lVar14) != (void *)0x0) {
          operator_delete__(*(void **)((long)&uStack_280 + lVar14));
        }
        lVar14 = lVar14 + -0x18;
      } while (lVar14 != 0);
      lVar14 = 0x30;
      do {
        pvVar3 = *(void **)((long)alStack_270 + lVar14 + 0x20);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        lVar14 = lVar14 + -0x18;
      } while (lVar14 != 0);
      lVar14 = 0x30;
      do {
        if (*(void **)((long)&local_350 + lVar14) != (void *)0x0) {
          operator_delete__(*(void **)((long)&local_350 + lVar14));
        }
        lVar14 = lVar14 + -0x18;
      } while (lVar14 != 0);
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&file_1);
      remove(fn._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      lVar14 = -0x40;
      plVar28 = local_1c8;
      do {
        if (plVar28 != (long *)plVar28[-2]) {
          operator_delete((long *)plVar28[-2],*plVar28 + 1);
        }
        plVar28 = plVar28 + -4;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fn._M_dataplus._M_p != &fn.field_2) {
        operator_delete(fn._M_dataplus._M_p,fn.field_2._M_allocated_capacity + 1);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != 3);
    local_35c = local_35c + 1;
    if (local_35c == 3) {
      iVar11 = IlmThread_3_2::ThreadPool::globalThreadPool();
      IlmThread_3_2::ThreadPool::setNumThreads(iVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      return;
    }
  } while( true );
}

Assistant:

void
testMultiScanlinePartThreading (const std::string& tempDir)
{
    try
    {
        cout
            << "Testing the two threads reading/writing on two-scanline-part file"
            << endl;

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        int pixelTypes[2];

        for (int i = 0; i < 3; i++)
            for (int j = 0; j < 3; j++)
            {
                pixelTypes[0] = i;
                pixelTypes[1] = j;
                testWriteRead (pixelTypes, tempDir);
            }

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}